

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

GetDefaultBlindingKeyRequest * __thiscall
cfd::js::api::json::GetDefaultBlindingKeyRequest::GetMasterBlindingKeyString_abi_cxx11_
          (GetDefaultBlindingKeyRequest *this,GetDefaultBlindingKeyRequest *obj)

{
  GetDefaultBlindingKeyRequest *obj_local;
  
  core::ConvertToString<std::__cxx11::string>((core *)this,&obj->master_blinding_key_);
  return this;
}

Assistant:

static std::string GetMasterBlindingKeyString(  // line separate
      const GetDefaultBlindingKeyRequest& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.master_blinding_key_);
  }